

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O3

void __thiscall pmx::PmxBone::Read(PmxBone *this,istream *stream,PmxSetting *setting)

{
  ushort uVar1;
  int iVar2;
  PmxIkLink *pPVar3;
  uint8_t in_CL;
  PmxIkLink *pPVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  string local_50;
  
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->bone_english_name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::istream::read((char *)stream,(long)this->position);
  iVar2 = ReadIndex(stream,(uint)setting->bone_index_size);
  this->parent_index = iVar2;
  std::istream::read((char *)stream,(long)&this->level);
  std::istream::read((char *)stream,(long)&this->bone_flag);
  if ((this->bone_flag & 1) == 0) {
    std::istream::read((char *)stream,(long)this->offset);
  }
  else {
    iVar2 = ReadIndex(stream,(uint)setting->bone_index_size);
    this->target_index = iVar2;
  }
  uVar1 = this->bone_flag;
  if ((uVar1 & 0x300) != 0) {
    iVar2 = ReadIndex(stream,(uint)setting->bone_index_size);
    this->grant_parent_index = iVar2;
    std::istream::read((char *)stream,(long)&this->grant_weight);
    uVar1 = this->bone_flag;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    std::istream::read((char *)stream,(long)this->lock_axis_orientation);
    uVar1 = this->bone_flag;
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    std::istream::read((char *)stream,(long)this->local_axis_x_orientation);
    std::istream::read((char *)stream,(long)this->local_axis_y_orientation);
    uVar1 = this->bone_flag;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    std::istream::read((char *)stream,(long)&this->key);
    uVar1 = this->bone_flag;
  }
  if ((uVar1 & 0x20) != 0) {
    iVar2 = ReadIndex(stream,(uint)setting->bone_index_size);
    this->ik_target_bone_index = iVar2;
    std::istream::read((char *)stream,(long)&this->ik_loop);
    std::istream::read((char *)stream,(long)&this->ik_loop_angle_limit);
    std::istream::read((char *)stream,(long)&this->ik_link_count);
    iVar2 = this->ik_link_count;
    lVar6 = (long)iVar2;
    uVar5 = 0xffffffffffffffff;
    if (-1 < lVar6) {
      uVar5 = lVar6 * 0x20;
    }
    pPVar3 = (PmxIkLink *)operator_new__(uVar5);
    if (lVar6 != 0) {
      pPVar4 = pPVar3;
      do {
        pPVar4->link_target = 0;
        pPVar4->angle_lock = '\0';
        pPVar4->max_radian[0] = 0.0;
        pPVar4->max_radian[1] = 0.0;
        *(undefined8 *)(pPVar4->max_radian + 2) = 0;
        pPVar4->min_radian[1] = 0.0;
        pPVar4->min_radian[2] = 0.0;
        pPVar4 = pPVar4 + 1;
      } while (pPVar4 != pPVar3 + lVar6);
    }
    pPVar4 = (this->ik_links)._M_t.
             super___uniq_ptr_impl<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxIkLink_*,_std::default_delete<pmx::PmxIkLink[]>_>.
             super__Head_base<0UL,_pmx::PmxIkLink_*,_false>._M_head_impl;
    (this->ik_links)._M_t.
    super___uniq_ptr_impl<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxIkLink_*,_std::default_delete<pmx::PmxIkLink[]>_>.
    super__Head_base<0UL,_pmx::PmxIkLink_*,_false>._M_head_impl = pPVar3;
    if (pPVar4 != (PmxIkLink *)0x0) {
      operator_delete__(pPVar4);
      iVar2 = this->ik_link_count;
    }
    if (0 < iVar2) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        PmxIkLink::Read((PmxIkLink *)
                        ((long)((this->ik_links)._M_t.
                                super___uniq_ptr_impl<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pmx::PmxIkLink_*,_std::default_delete<pmx::PmxIkLink[]>_>
                                .super__Head_base<0UL,_pmx::PmxIkLink_*,_false>._M_head_impl)->
                               max_radian + lVar6 + -8),stream,setting);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (lVar7 < this->ik_link_count);
    }
  }
  return;
}

Assistant:

void PmxBone::Read(std::istream *stream, PmxSetting *setting)
	{
		this->bone_name = std::move(ReadString(stream, setting->encoding));
		this->bone_english_name = std::move(ReadString(stream, setting->encoding));
		stream->read((char*) this->position, sizeof(float) * 3);
		this->parent_index = ReadIndex(stream, setting->bone_index_size);
		stream->read((char*) &this->level, sizeof(int));
		stream->read((char*) &this->bone_flag, sizeof(uint16_t));
		if (this->bone_flag & 0x0001) {
			this->target_index = ReadIndex(stream, setting->bone_index_size);
		}
		else {
			stream->read((char*)this->offset, sizeof(float) * 3);
		}
		if (this->bone_flag & (0x0100 | 0x0200)) {
			this->grant_parent_index = ReadIndex(stream, setting->bone_index_size);
			stream->read((char*) &this->grant_weight, sizeof(float));
		}
		if (this->bone_flag & 0x0400) {
			stream->read((char*)this->lock_axis_orientation, sizeof(float) * 3);
		}
		if (this->bone_flag & 0x0800) {
			stream->read((char*)this->local_axis_x_orientation, sizeof(float) * 3);
			stream->read((char*)this->local_axis_y_orientation, sizeof(float) * 3);
		}
		if (this->bone_flag & 0x2000) {
			stream->read((char*) &this->key, sizeof(int));
		}
		if (this->bone_flag & 0x0020) {
			this->ik_target_bone_index = ReadIndex(stream, setting->bone_index_size);
			stream->read((char*) &ik_loop, sizeof(int));
			stream->read((char*) &ik_loop_angle_limit, sizeof(float));
			stream->read((char*) &ik_link_count, sizeof(int));
			this->ik_links = std::make_unique<PmxIkLink []>(ik_link_count);
			for (int i = 0; i < ik_link_count; i++) {
				ik_links[i].Read(stream, setting);
			}
		}
	}